

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c382::ktxTexture2_BasisCompressTest_Compress_Test::TestBody
          (ktxTexture2_BasisCompressTest_Compress_Test *this)

{
  ktx_uint8_t *pkVar1;
  Message *message;
  AssertHelper *this_00;
  char *pcVar2;
  char *in_R9;
  bool bVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertionResult gtest_ar_;
  AssertHelper local_58;
  ktxTexture2 *texture;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  AssertHelper local_20;
  ktx_uint64_t dataSize;
  
  pkVar1 = (this->super_ktxTexture2_BasisCompressTest).
           super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
           super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.ktxMemFile;
  if (pkVar1 == (ktx_uint8_t *)0x0) {
    return;
  }
  result = ktxTexture2_CreateFromMemory
                     (pkVar1,(this->super_ktxTexture2_BasisCompressTest).
                             super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
                             super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.ktxMemFileLen,1,
                      &texture);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar3 = result == KTX_SUCCESS;
  gtest_ar_.success_ = bVar3;
  if (bVar3) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = texture != (ktxTexture2 *)0x0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_70);
      std::operator<<((ostream *)(local_70._M_head_impl + 0x10),
                      "ktxTexture_CreateFromMemory failed: ");
      local_58.data_ = (AssertHelperData *)ktxErrorString(result);
      message = testing::Message::operator<<((Message *)&local_70,(char **)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x16292e,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0x8ec,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_20,message);
      this_00 = &local_20;
      goto LAB_00130eb6;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = texture->pData != (ktx_uint8_t *)0x0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      dataSize = texture->dataSize;
      result = ktxTexture2_CompressBasis(texture,0);
      gtest_ar_.success_ = false;
      gtest_ar_._1_3_ = 0;
      testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
                ((internal *)&gtest_ar,"result","KTX_SUCCESS",&result,(ktx_error_code_e *)&gtest_ar_
                );
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x8f2,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
        if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      gtest_ar_.success_ = true;
      gtest_ar_._1_3_ = 0;
      testing::internal::CmpHelperEQ<ktxSupercmpScheme,ktxSupercmpScheme>
                ((internal *)&gtest_ar,"texture->supercompressionScheme","KTX_SS_BASIS_LZ",
                 &texture->supercompressionScheme,(ktxSupercmpScheme *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x8f3,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
        if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      bVar3 = texture->_private->_supercompressionGlobalData != (ktx_uint8_t *)0x0;
      gtest_ar_.success_ = bVar3;
      if (!bVar3) {
        testing::Message::Message((Message *)&local_70);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "texture->_private->_supercompressionGlobalData > (ktx_uint8_t*)0","false","true"
                   ,in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x8f4,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (local_70._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_70._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar,"texture->numLevels","helper.numLevels",&texture->numLevels,
                 (uint *)&(this->super_ktxTexture2_BasisCompressTest).
                          super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
                          super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.helper);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x8f5,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
        if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"texture->dataSize","dataSize",&texture->dataSize,&dataSize);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x8f6,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
        if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      result = ktxTexture2_TranscodeBasis(texture,2,0);
      gtest_ar_.success_ = false;
      gtest_ar_._1_3_ = 0;
      testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
                ((internal *)&gtest_ar,"result","KTX_SUCCESS",&result,(ktx_error_code_e *)&gtest_ar_
                );
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x8fa,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
        if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      if (texture == (ktxTexture2 *)0x0) {
        return;
      }
      (*texture->vtbl->Destroy)((ktxTexture *)texture);
      return;
    }
    testing::Message::Message((Message *)&local_70);
    std::operator<<((ostream *)(local_70._M_head_impl + 0x10),"Image data not loaded");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"texture->pData != __null","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x8ee,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_70);
  }
  else {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"result == KTX_SUCCESS"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x8eb,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_70);
  }
  this_00 = &local_58;
LAB_00130eb6:
  testing::internal::AssertHelper::~AssertHelper(this_00);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (local_70._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(ktxTexture2_BasisCompressTest, Compress) {
    ktxTexture2* texture;
    ktx_uint64_t dataSize;
    KTX_error_code result;

    if (ktxMemFile != NULL) {
        result = ktxTexture2_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                              KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                              &texture);
        ASSERT_TRUE(result == KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->pData != NULL) << "Image data not loaded";

        dataSize = texture->dataSize;
        result = ktxTexture2_CompressBasis(texture, 0);
        EXPECT_EQ(result, KTX_SUCCESS);
        EXPECT_EQ(texture->supercompressionScheme, KTX_SS_BASIS_LZ);
        EXPECT_TRUE(texture->_private->_supercompressionGlobalData > (ktx_uint8_t*)0);
        EXPECT_EQ(texture->numLevels, helper.numLevels);
        EXPECT_LT(texture->dataSize, dataSize);
        // How else to test the result?

        result = ktxTexture2_TranscodeBasis(texture, KTX_TTF_BC1_RGB, 0);
        EXPECT_EQ(result, KTX_SUCCESS);
        if (texture)
            ktxTexture_Destroy(ktxTexture(texture));
    }
}